

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

ostream * operator<<(ostream *os,cmListFileContext *lfc)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,(lfc->FilePath)._M_dataplus._M_p,(lfc->FilePath)._M_string_length);
  if (lfc->Line != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,":",1);
    std::ostream::_M_insert<long>((long)os);
    if ((lfc->Name)._M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(lfc->Name)._M_dataplus._M_p,(lfc->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmListFileContext const& lfc)
{
  os << lfc.FilePath;
  if(lfc.Line)
    {
    os << ":" << lfc.Line;
    if(!lfc.Name.empty())
      {
      os << " (" << lfc.Name << ")";
      }
    }
  return os;
}